

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryReader::verifyInt8(WasmBinaryReader *this,int8_t x)

{
  allocator<char> local_39;
  string local_38;
  uint8_t local_12;
  uint8_t local_11;
  int8_t y;
  WasmBinaryReader *pWStack_10;
  int8_t x_local;
  WasmBinaryReader *this_local;
  
  local_11 = x;
  pWStack_10 = this;
  local_12 = getInt8(this);
  if (local_11 != local_12) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"surprising value",&local_39);
    throwError(this,&local_38);
  }
  return;
}

Assistant:

void WasmBinaryReader::verifyInt8(int8_t x) {
  int8_t y = getInt8();
  if (x != y) {
    throwError("surprising value");
  }
}